

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitPow2
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,UnaryExpr e)

{
  Buffer<char> *pBVar1;
  ulong uVar2;
  
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ +
             8))->impl_,0xc);
  pBVar1 = this->writer_->buffer_;
  uVar2 = pBVar1->size_ + 4;
  if (pBVar1->capacity_ < uVar2) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," ^ 2",4);
  pBVar1->size_ = uVar2;
  return;
}

Assistant:

void VisitPow2(UnaryExpr e) {
    Visit(e.arg(), prec::EXPONENTIATION + 1);
    writer_ << " ^ 2";
  }